

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_> __thiscall
testing::Return<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>>
          (testing *this,vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *value)

{
  linked_ptr_internal extraout_RDX;
  ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_> RVar1;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_30;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *local_18;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *value_local;
  
  local_18 = value;
  value_local = (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)this;
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector(&local_30,value);
  internal::ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>::
  ReturnAction((ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_> *)this,
               &local_30);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector(&local_30);
  RVar1.value_.link_.next_ = extraout_RDX.next_;
  RVar1.value_.value_ = (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)this;
  return (ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>)RVar1.value_;
}

Assistant:

internal::ReturnAction<R> Return(R value) {
  return internal::ReturnAction<R>(internal::move(value));
}